

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_3fPoint::IsNotZero(ON_3fPoint *this)

{
  bool local_1a;
  bool local_19;
  ON_3fPoint *this_local;
  
  if (((((this->x == 0.0) && (!NAN(this->x))) && (this->y == 0.0)) &&
      ((!NAN(this->y) && (this->z == 0.0)))) && (!NAN(this->z))) {
    return false;
  }
  local_19 = false;
  if ((this->x != -1.234321e+38) || (NAN(this->x))) {
    local_19 = false;
    if ((this->y != -1.234321e+38) || (NAN(this->y))) {
      local_19 = false;
      if ((this->z != -1.234321e+38) || (NAN(this->z))) {
        local_1a = false;
        if ((this->x != 1.234321e+38) || (NAN(this->x))) {
          local_1a = false;
          if ((this->y != 1.234321e+38) || (NAN(this->y))) {
            local_1a = this->z != 1.234321e+38;
          }
        }
        local_19 = local_1a;
      }
    }
  }
  return local_19;
}

Assistant:

bool ON_3fPoint::IsNotZero() const
{
  // the && (x != ON_UNSET_FLOAT && y != ON_UNSET_FLOAT && z != ON_UNSET_FLOAT) insures no coordinate is a Nan.
  return
    (x != 0.0f || y != 0.0f || z != 0.0f)
    && (x != ON_UNSET_FLOAT && y != ON_UNSET_FLOAT && z != ON_UNSET_FLOAT)
    && (x != ON_UNSET_POSITIVE_FLOAT && y != ON_UNSET_POSITIVE_FLOAT && z != ON_UNSET_POSITIVE_FLOAT);
}